

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

bool group_like(Am_Object *object)

{
  bool bVar1;
  bool bVar2;
  bool local_42;
  Am_Object local_40 [3];
  byte local_21;
  Am_Object local_20;
  Am_Object *local_18;
  Am_Object *object_local;
  
  local_18 = object;
  bVar2 = Am_Is_Group_Or_Map(object);
  local_21 = 0;
  bVar1 = false;
  local_42 = true;
  if (!bVar2) {
    Am_Object::Am_Object(&local_20,&Am_Window);
    local_21 = 1;
    bVar2 = Am_Object::Is_Instance_Of(object,&local_20);
    local_42 = true;
    if (!bVar2) {
      Am_Object::Am_Object(local_40,&Am_Screen);
      bVar1 = true;
      local_42 = Am_Object::Is_Instance_Of(object,local_40);
    }
  }
  object_local._7_1_ = local_42;
  if (bVar1) {
    Am_Object::~Am_Object(local_40);
  }
  if ((local_21 & 1) != 0) {
    Am_Object::~Am_Object(&local_20);
  }
  return (bool)(object_local._7_1_ & 1);
}

Assistant:

inline bool
group_like(Am_Object object)
{
  return (Am_Is_Group_Or_Map(object) || object.Is_Instance_Of(Am_Window) ||
          object.Is_Instance_Of(Am_Screen));
}